

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_imply_m3(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2)

{
  int local_9c;
  REF_STATUS ref_private_macro_code_raise;
  REF_INT i;
  REF_DBL ab [12];
  REF_DBL *xyz2_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  REF_DBL *m_local;
  
  for (local_9c = 0; local_9c < 6; local_9c = local_9c + 1) {
    m[local_9c] = 0.0;
  }
  _ref_private_macro_code_raise = (*xyz0 - *xyz1) * (*xyz0 - *xyz1);
  ab[2] = (*xyz0 - *xyz1) * 2.0 * (xyz0[1] - xyz1[1]);
  ab[5] = (xyz0[1] - xyz1[1]) * (xyz0[1] - xyz1[1]);
  ab[0] = (*xyz1 - *xyz2) * (*xyz1 - *xyz2);
  ab[3] = (*xyz1 - *xyz2) * 2.0 * (xyz1[1] - xyz2[1]);
  ab[6] = (xyz1[1] - xyz2[1]) * (xyz1[1] - xyz2[1]);
  ab[1] = (*xyz2 - *xyz0) * (*xyz2 - *xyz0);
  ab[4] = (*xyz2 - *xyz0) * 2.0 * (xyz2[1] - xyz0[1]);
  ab[7] = (xyz2[1] - xyz0[1]) * (xyz2[1] - xyz0[1]);
  for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
    (&ref_private_macro_code_raise + (long)(local_9c + 9) * 2)[0] = 0;
    (&ref_private_macro_code_raise + (long)(local_9c + 9) * 2)[1] = 0x3ff00000;
  }
  m_local._4_4_ = ref_matrix_solve_ab(3,4,(REF_DBL *)&ref_private_macro_code_raise);
  if (m_local._4_4_ == 0) {
    *m = ab[8];
    m[1] = ab[9];
    m[2] = 0.0;
    m[3] = ab[10];
    m[4] = 0.0;
    m[5] = 1.0;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m3(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                       REF_DBL *xyz2) {
  REF_DBL ab[12];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab3(0, xyz0, xyz1);
  fill_ab3(1, xyz1, xyz2);
  fill_ab3(2, xyz2, xyz0);

  for (i = 0; i < 3; i++) ab[i + 3 * 3] = 1.0;

  RAISE(ref_matrix_solve_ab(3, 4, ab));

  m[0] = ab[0 + 3 * 3];
  m[1] = ab[1 + 3 * 3];
  m[2] = 0.0;
  m[3] = ab[2 + 3 * 3];
  m[4] = 0.0;
  m[5] = 1.0;

  return REF_SUCCESS;
}